

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::error
          (CAPIBuildSystemFrontendDelegate *this,StringRef filename,Token *at,Twine *message)

{
  _func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *p_Var1;
  void *pvVar2;
  char *pcVar3;
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  pcVar3 = filename.Data;
  p_Var1 = (this->cAPIDelegate).handle_diagnostic;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)
                0x0) {
    pvVar2 = (this->cAPIDelegate).context;
    local_70 = &local_60;
    if (pcVar3 == (char *)0x0) {
      local_68 = 0;
      local_60 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar3,pcVar3 + filename.Length);
    }
    pcVar3 = local_70;
    llvm::Twine::str_abi_cxx11_(&local_50,message);
    (*p_Var1)(pvVar2,llb_buildsystem_diagnostic_kind_error,pcVar3,-1,-1,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    return;
  }
  llbuild::buildsystem::BuildSystemFrontendDelegate::error
            (&this->super_BuildSystemFrontendDelegate,filename,at,message);
  return;
}

Assistant:

virtual void error(StringRef filename, const Token& at, const Twine& message) override {
    if (cAPIDelegate.handle_diagnostic) {
      cAPIDelegate.handle_diagnostic(cAPIDelegate.context,
                                     llb_buildsystem_diagnostic_kind_error,
                                     filename.str().c_str(),
                                     -1,
                                     -1,
                                     message.str().c_str());
    } else {
        BuildSystemFrontendDelegate::error(filename, at, message);
    }
  }